

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MS3DImporter::InternReadFile
          (MS3DImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer pTVar1;
  pointer *ppuVar2;
  aiColor4D *ambient;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  long *plVar17;
  undefined8 *puVar18;
  void *pvVar19;
  pointer pTVar20;
  pointer pTVar21;
  pointer pTVar22;
  char cVar23;
  unsigned_short uVar24;
  short sVar25;
  unsigned_short uVar26;
  int iVar27;
  ai_uint32 aVar28;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  char *pcVar29;
  Logger *pLVar30;
  aiMaterial **ppaVar31;
  aiMaterial *this_00;
  size_t sVar32;
  aiMesh **__s;
  aiMesh *paVar33;
  ulong *puVar34;
  aiFace *paVar35;
  aiVector3D *paVar36;
  uint *puVar37;
  ulong uVar38;
  mapped_type *pmVar39;
  aiBone **__s_00;
  aiBone *paVar40;
  aiVertexWeight *paVar41;
  undefined8 uVar42;
  aiNode *this_01;
  aiNode **ppaVar43;
  aiNode *this_02;
  aiAnimation **ppaVar44;
  aiAnimation *paVar45;
  aiNodeAnim **__s_01;
  aiNodeAnim *paVar46;
  aiQuatKey *paVar47;
  aiVectorKey *paVar48;
  pointer pTVar49;
  runtime_error *prVar50;
  bool bVar51;
  aiFace *paVar52;
  ulong uVar53;
  ulong uVar54;
  undefined1 *puVar55;
  aiQuatKey *paVar56;
  ulong uVar57;
  uint uVar58;
  ulong uVar59;
  float *pInput;
  undefined1 *puVar60;
  undefined1 *puVar61;
  const_iterator it;
  pointer pTVar62;
  pointer pTVar63;
  long lVar64;
  aiBone ***pppaVar65;
  uint i;
  long lVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  uint extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  uint extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  float fVar74;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  uint extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  aiQuaternion aVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar97;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  StreamReaderLE stream;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_> joints;
  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
  materials;
  vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_> groups;
  char head [10];
  vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
  vertices;
  vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
  triangles;
  aiString tmp;
  int sm;
  long local_a88;
  long local_a78;
  long local_a68;
  StreamReader<false,_false> local_a20;
  vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
  local_9e8;
  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
  local_9d0;
  char *local_9b8;
  ulong local_9b0;
  char local_9a8 [16];
  undefined8 local_998;
  undefined8 local_988;
  undefined4 uStack_980;
  undefined4 uStack_97c;
  undefined8 local_978;
  undefined8 local_968;
  uint uStack_960;
  uint uStack_95c;
  vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
  local_950;
  long local_938;
  short local_930;
  float local_928;
  uint uStack_924;
  uint uStack_920;
  uint uStack_91c;
  vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
  local_918;
  vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
  local_900;
  float local_8e8;
  undefined1 local_8d8 [16];
  float local_8c8;
  float local_8b8;
  float local_8a8;
  undefined4 uStack_8a4;
  undefined4 uStack_8a0;
  undefined4 uStack_89c;
  float local_898;
  uint uStack_894;
  uint uStack_890;
  uint uStack_88c;
  float local_888;
  float local_878;
  float local_868;
  uint uStack_864;
  uint uStack_860;
  uint uStack_85c;
  float local_858;
  undefined1 local_840 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_830;
  _Rb_tree_node_base *local_820;
  ulong local_818;
  ios_base local_7d0 [256];
  _Alloc_hider local_6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c0 [40];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_438 [43];
  
  local_998 = this;
  local_840._0_8_ = &local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"rb","");
  iVar27 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_840._0_8_);
  StreamReader<false,_false>::StreamReader
            (&local_a20,(IOStream *)CONCAT44(extraout_var,iVar27),false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._0_8_ != &local_830) {
    operator_delete((void *)local_840._0_8_);
  }
  local_998->mScene = pScene;
  plVar17 = (long *)CONCAT44(local_a20.current._4_4_,(int)local_a20.current);
  StreamReader<false,_false>::SetPtr(&local_a20,(int8_t *)((long)plVar17 + 10));
  local_930 = (short)plVar17[1];
  local_938 = *plVar17;
  iVar27 = StreamReader<false,_false>::Get<int>(&local_a20);
  if (local_930 != 0x3030 || local_938 != 0x303030304433534d) {
    prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_840,
                   "Not a MS3D file, magic string MS3D000000 not found: ",pFile);
    std::runtime_error::runtime_error(prVar50,(string *)local_840);
    *(undefined ***)prVar50 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar50,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (iVar27 != 4) {
    prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_840._0_8_ = &local_830;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_840,"MS3D: Unsupported file format version, 4 was expected","");
    std::runtime_error::runtime_error(prVar50,(string *)local_840);
    *(undefined ***)prVar50 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar50,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar24 = StreamReader<false,_false>::Get<unsigned_short>(&local_a20);
  local_968 = (ulong)uVar24;
  std::vector<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>::
  vector(&local_918,local_968,(allocator_type *)local_840);
  local_978 = (pointer)CONCAT62(local_978._2_6_,uVar24);
  if (uVar24 != 0) {
    iVar27 = (int)local_968;
    lVar66 = 0;
    do {
      pTVar21 = local_918.
                super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                ._M_impl.super__Vector_impl_data._M_start;
      StreamReader<false,_false>::IncPtr(&local_a20,1);
      ReadVector(&local_a20,(aiVector3D *)((long)pTVar21->bone_id + lVar66 + -0xc));
      cVar23 = StreamReader<false,_false>::Get<signed_char>(&local_a20);
      *(int *)((long)pTVar21->bone_id + lVar66) = (int)cVar23;
      cVar23 = StreamReader<false,_false>::Get<signed_char>(&local_a20);
      *(int *)((long)pTVar21->weights + lVar66 + -4) = (int)cVar23;
      *(undefined4 *)((long)pTVar21->bone_id + lVar66 + 0xc) = 0xffffffff;
      *(undefined8 *)((long)pTVar21->bone_id + lVar66 + 4) = 0xffffffffffffffff;
      puVar18 = (undefined8 *)((long)pTVar21->weights + lVar66);
      *puVar18 = 0x3f800000;
      puVar18[1] = 0;
      lVar66 = lVar66 + 0x30;
    } while ((ulong)(uint)(iVar27 << 4) * 3 != lVar66);
  }
  uVar24 = StreamReader<false,_false>::Get<unsigned_short>(&local_a20);
  std::
  vector<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>::
  vector(&local_900,(ulong)uVar24,(allocator_type *)local_840);
  if (uVar24 != 0) {
    local_a78 = 0x30;
    local_a68 = 0x34;
    local_a88 = 0;
    uVar59 = 0;
    do {
      pTVar22 = local_900.
                super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                ._M_impl.super__Vector_impl_data._M_start;
      StreamReader<false,_false>::IncPtr(&local_a20,2);
      lVar66 = 0;
      do {
        sVar25 = StreamReader<false,_false>::Get<short>(&local_a20);
        *(int *)((long)pTVar22->indices + lVar66 * 4 + local_a88) = (int)sVar25;
        lVar66 = lVar66 + 1;
      } while (lVar66 != 3);
      lVar66 = 0xc;
      do {
        ReadVector(&local_a20,(aiVector3D *)((long)pTVar22->indices + lVar66 + local_a88));
        lVar66 = lVar66 + 0xc;
      } while (lVar66 != 0x30);
      lVar66 = 0;
      do {
        fVar67 = StreamReader<false,_false>::Get<float>(&local_a20);
        *(float *)((long)pTVar22->indices + lVar66 * 8 + local_a78) = fVar67;
        lVar66 = lVar66 + 1;
      } while (lVar66 != 3);
      lVar66 = 0;
      do {
        fVar67 = StreamReader<false,_false>::Get<float>(&local_a20);
        *(float *)((long)pTVar22->indices + lVar66 * 8 + local_a68) = fVar67;
        lVar66 = lVar66 + 1;
      } while (lVar66 != 3);
      cVar23 = StreamReader<false,_false>::Get<signed_char>(&local_a20);
      pTVar22[uVar59].sg = (int)cVar23;
      cVar23 = StreamReader<false,_false>::Get<signed_char>(&local_a20);
      pTVar22[uVar59].group = (int)cVar23;
      uVar59 = uVar59 + 1;
      local_a88 = local_a88 + 0x50;
      local_a78 = local_a78 + 0x50;
      local_a68 = local_a68 + 0x50;
    } while (uVar59 != uVar24);
  }
  uVar24 = StreamReader<false,_false>::Get<unsigned_short>(&local_a20);
  std::vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>::
  vector(&local_950,(ulong)uVar24,(allocator_type *)local_840);
  if (uVar24 == 0) {
    bVar51 = false;
  }
  else {
    uVar59 = 0;
    bVar51 = false;
    do {
      pTVar63 = local_950.
                super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar59;
      StreamReader<false,_false>::IncPtr(&local_a20,1);
      puVar18 = (undefined8 *)CONCAT44(local_a20.current._4_4_,(int)local_a20.current);
      StreamReader<false,_false>::SetPtr(&local_a20,(int8_t *)(puVar18 + 4));
      uVar42 = *puVar18;
      uVar15 = puVar18[1];
      *(undefined1 (*) [16])(pTVar63->name + 0x10) = *(undefined1 (*) [16])(puVar18 + 2);
      *(undefined8 *)pTVar63->name = uVar42;
      *(undefined8 *)(pTVar63->name + 8) = uVar15;
      pTVar63->name[0x20] = '\0';
      uVar26 = StreamReader<false,_false>::Get<unsigned_short>(&local_a20);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&pTVar63->triangles,(ulong)uVar26);
      if (uVar26 != 0) {
        uVar57 = 0;
        do {
          sVar25 = StreamReader<false,_false>::Get<short>(&local_a20);
          (pTVar63->triangles).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar57] = (int)sVar25;
          uVar57 = uVar57 + 1;
        } while (uVar26 != uVar57);
      }
      cVar23 = StreamReader<false,_false>::Get<signed_char>(&local_a20);
      pTVar63->mat = (int)cVar23;
      bVar51 = (bool)(bVar51 | cVar23 == -1);
      uVar59 = uVar59 + 1;
    } while (uVar59 != uVar24);
  }
  uVar24 = StreamReader<false,_false>::Get<unsigned_short>(&local_a20);
  std::
  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>::
  vector(&local_9d0,(ulong)uVar24,(allocator_type *)local_840);
  if (uVar24 != 0) {
    lVar66 = 0;
    do {
      pTVar20 = local_9d0.
                super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar18 = (undefined8 *)CONCAT44(local_a20.current._4_4_,(int)local_a20.current);
      StreamReader<false,_false>::SetPtr(&local_a20,(int8_t *)(puVar18 + 4));
      pcVar29 = pTVar20->name + lVar66;
      uVar42 = *puVar18;
      uVar15 = puVar18[1];
      *(undefined1 (*) [16])(pcVar29 + 0x10) = *(undefined1 (*) [16])(puVar18 + 2);
      *(undefined8 *)pcVar29 = uVar42;
      *(undefined8 *)(pcVar29 + 8) = uVar15;
      ambient = (aiColor4D *)((long)&(pTVar20->ambient).r + lVar66);
      *(undefined1 *)&ambient[-0x13].a = 0;
      ReadColor(&local_a20,ambient);
      ReadColor(&local_a20,(aiColor4D *)((long)&(pTVar20->diffuse).r + lVar66));
      ReadColor(&local_a20,(aiColor4D *)((long)&(pTVar20->specular).r + lVar66));
      ReadColor(&local_a20,(aiColor4D *)((long)&(pTVar20->emissive).r + lVar66));
      fVar67 = StreamReader<false,_false>::Get<float>(&local_a20);
      *(float *)((long)&pTVar20->shininess + lVar66) = fVar67;
      fVar67 = StreamReader<false,_false>::Get<float>(&local_a20);
      *(float *)((long)&pTVar20->transparency + lVar66) = fVar67;
      StreamReader<false,_false>::IncPtr(&local_a20,1);
      pvVar19 = (void *)CONCAT44(local_a20.current._4_4_,(int)local_a20.current);
      StreamReader<false,_false>::SetPtr(&local_a20,(int8_t *)((long)pvVar19 + 0x80));
      memcpy(pTVar20->texture + lVar66,pvVar19,0x80);
      (pTVar20->texture + lVar66)[0x80] = '\0';
      pvVar19 = (void *)CONCAT44(local_a20.current._4_4_,(int)local_a20.current);
      StreamReader<false,_false>::SetPtr(&local_a20,(int8_t *)((long)pvVar19 + 0x80));
      memcpy(pTVar20->alphamap + lVar66,pvVar19,0x80);
      (pTVar20->alphamap + lVar66)[0x80] = '\0';
      lVar66 = lVar66 + 400;
    } while ((ulong)uVar24 * 400 - lVar66 != 0);
  }
  fVar67 = StreamReader<false,_false>::Get<float>(&local_a20);
  StreamReader<false,_false>::Get<float>(&local_a20);
  StreamReader<false,_false>::Get<unsigned_int>(&local_a20);
  uVar24 = StreamReader<false,_false>::Get<unsigned_short>(&local_a20);
  std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>::
  vector(&local_9e8,(ulong)uVar24,(allocator_type *)local_840);
  if (uVar24 != 0) {
    uVar59 = 0;
    do {
      pTVar62 = local_9e8.
                super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar59;
      StreamReader<false,_false>::IncPtr(&local_a20,1);
      puVar18 = (undefined8 *)CONCAT44(local_a20.current._4_4_,(int)local_a20.current);
      StreamReader<false,_false>::SetPtr(&local_a20,(int8_t *)(puVar18 + 4));
      uVar42 = *puVar18;
      uVar15 = puVar18[1];
      uVar16 = puVar18[3];
      *(undefined8 *)(pTVar62->name + 0x10) = puVar18[2];
      *(undefined8 *)(pTVar62->name + 0x18) = uVar16;
      *(undefined8 *)pTVar62->name = uVar42;
      *(undefined8 *)(pTVar62->name + 8) = uVar15;
      pTVar62->name[0x20] = '\0';
      puVar18 = (undefined8 *)CONCAT44(local_a20.current._4_4_,(int)local_a20.current);
      StreamReader<false,_false>::SetPtr(&local_a20,(int8_t *)(puVar18 + 4));
      uVar42 = *puVar18;
      uVar15 = puVar18[1];
      *(undefined1 (*) [16])(pTVar62->parentName + 0x10) = *(undefined1 (*) [16])(puVar18 + 2);
      *(undefined8 *)pTVar62->parentName = uVar42;
      *(undefined8 *)(pTVar62->parentName + 8) = uVar15;
      pTVar62->parentName[0x20] = '\0';
      ReadVector(&local_a20,&pTVar62->rotation);
      ReadVector(&local_a20,&pTVar62->position);
      sVar25 = StreamReader<false,_false>::Get<short>(&local_a20);
      std::
      vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
      ::resize(&pTVar62->rotFrames,(long)sVar25);
      sVar25 = StreamReader<false,_false>::Get<short>(&local_a20);
      std::
      vector<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
      ::resize(&pTVar62->posFrames,(long)sVar25);
      pTVar49 = (pTVar62->rotFrames).
                super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pTVar62->rotFrames).
          super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar49) {
        uVar58 = 1;
        uVar57 = 0;
        do {
          fVar68 = StreamReader<false,_false>::Get<float>(&local_a20);
          pTVar49[uVar57].time = fVar68;
          ReadVector(&local_a20,&pTVar49[uVar57].value);
          uVar57 = (ulong)uVar58;
          pTVar49 = (pTVar62->rotFrames).
                    super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar58 = uVar58 + 1;
        } while (uVar57 < (ulong)((long)(pTVar62->rotFrames).
                                        super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar49
                                 >> 4));
      }
      pTVar49 = (pTVar62->posFrames).
                super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pTVar62->posFrames).
          super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar49) {
        uVar58 = 1;
        uVar57 = 0;
        do {
          fVar68 = StreamReader<false,_false>::Get<float>(&local_a20);
          pTVar49[uVar57].time = fVar68;
          ReadVector(&local_a20,&pTVar49[uVar57].value);
          uVar57 = (ulong)uVar58;
          pTVar49 = (pTVar62->posFrames).
                    super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar58 = uVar58 + 1;
        } while (uVar57 < (ulong)((long)(pTVar62->posFrames).
                                        super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar49
                                 >> 4));
      }
      uVar59 = uVar59 + 1;
    } while (uVar59 != uVar24);
  }
  sVar25 = (short)local_978;
  if ((4 < (uint)((int)local_a20.end - (int)local_a20.current)) &&
     (uVar58 = StreamReader<false,_false>::Get<unsigned_int>(&local_a20), uVar58 == 1)) {
    ReadComments<Assimp::MS3DImporter::TempGroup>(local_998,&local_a20,&local_950);
    ReadComments<Assimp::MS3DImporter::TempMaterial>(local_998,&local_a20,&local_9d0);
    ReadComments<Assimp::MS3DImporter::TempJoint>(local_998,&local_a20,&local_9e8);
    iVar27 = StreamReader<false,_false>::Get<int>(&local_a20);
    if (iVar27 != 0) {
      iVar27 = StreamReader<false,_false>::Get<int>(&local_a20);
      if ((ulong)(uint)((int)local_a20.end - (int)local_a20.current) < (ulong)(long)iVar27) {
        prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_840._0_8_ = &local_830;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_840,"MS3D: Model comment is too long","");
        std::runtime_error::runtime_error(prVar50,(string *)local_840);
        *(undefined ***)prVar50 = &PTR__runtime_error_007fc4b8;
        __cxa_throw(prVar50,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      ppuVar2 = &local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,CONCAT44(local_a20.current._4_4_,(int)local_a20.current),
                 (long)iVar27 + CONCAT44(local_a20.current._4_4_,(int)local_a20.current));
      pLVar30 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[22]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_840,
                 (char (*) [22])"MS3D: Model comment: ");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_840,
                 (char *)local_438[0].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                 (long)local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar30,local_9b8);
      if (local_9b8 != local_9a8) {
        operator_delete(local_9b8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_840);
      std::ios_base::~ios_base(local_7d0);
      if ((pointer *)
          local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != ppuVar2) {
        operator_delete(local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((4 < (uint)((int)local_a20.end - (int)local_a20.current)) &&
       (uVar58 = StreamReader<false,_false>::Get<unsigned_int>(&local_a20),
       sVar25 != 0 && (uVar58 & 0xfffffffe) == 2)) {
      lVar66 = 0x20;
      uVar59 = 0;
      do {
        pTVar21 = local_918.
                  super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_918.
        super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar59].weights[3] = 1.0;
        lVar64 = -3;
        do {
          cVar23 = StreamReader<false,_false>::Get<signed_char>(&local_a20);
          *(int *)((long)pTVar21->bone_id + lVar64 * 4 + lVar66 + -0x10) = (int)cVar23;
          cVar23 = StreamReader<false,_false>::Get<signed_char>(&local_a20);
          *(float *)((long)pTVar21->bone_id + lVar64 * 4 + lVar66) =
               (float)(uint)(int)cVar23 / 255.0;
          pTVar21[uVar59].weights[3] = pTVar21[uVar59].weights[3] - (float)(uint)(int)cVar23 / 255.0
          ;
          lVar64 = lVar64 + 1;
        } while (lVar64 != 0);
        StreamReader<false,_false>::IncPtr(&local_a20,(ulong)(uVar58 * 4 - 4));
        uVar59 = uVar59 + 1;
        lVar66 = lVar66 + 0x30;
      } while (uVar59 != local_968);
    }
  }
  if ((bVar51) &&
     (local_9d0.
      super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_9d0.
      super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    pLVar30 = DefaultLogger::get();
    Logger::warn(pLVar30,"MS3D: Found group with no material assigned, spawning default material");
    memset((TempMaterial *)local_840,0,400);
    local_6c0[0]._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)local_6c0;
    std::
    vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ::emplace_back<Assimp::MS3DImporter::TempMaterial>(&local_9d0,(TempMaterial *)local_840);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d0._M_p != local_6c0) {
      operator_delete(local_6d0._M_p);
    }
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0] = '<';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[1] = 'M';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[2] = 'S';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[3] = '3';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[4] = 'D';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[5] = '_';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[6] = 'D';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[7] = 'e';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[8] = 'f';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[9] = 'a';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[10] = 'u';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xb] = 'l';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xc] = 't';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xd] = 'M';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xe] = 'a';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0xf] = 't';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0x10] = '>';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].name[0x11] = '\0';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].diffuse.r = 0.6;
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].diffuse.g = 0.6;
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].diffuse.b = 0.6;
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].diffuse.a = 1.0;
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].shininess = 0.0;
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].transparency = 1.0;
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].alphamap[0] = '\0';
    local_9d0.
    super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].texture[0] = '\0';
    if (local_950.
        super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_950.
        super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar58 = 1;
      uVar59 = 0;
      do {
        if (local_950.
            super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar59].mat == 0xffffffff) {
          local_950.
          super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar59].mat =
               (int)((ulong)((long)local_9d0.
                                   super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_9d0.
                                  super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x3d70a3d7 - 1
          ;
        }
        uVar59 = (ulong)uVar58;
        uVar57 = ((long)local_950.
                        super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_950.
                        super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        uVar58 = uVar58 + 1;
      } while (uVar59 <= uVar57 && uVar57 - uVar59 != 0);
    }
  }
  if ((long)local_9d0.
            super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_9d0.
            super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar66 = (long)local_9d0.
                   super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_9d0.
                   super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    uVar59 = 0xffffffffffffffff;
    if ((ulong)(lVar66 * -0x70a3d70a3d70a3d7) < 0x2000000000000000) {
      uVar59 = lVar66 * 0x7ae147ae147ae148;
    }
    ppaVar31 = (aiMaterial **)operator_new__(uVar59);
    pScene->mMaterials = ppaVar31;
    lVar66 = 0;
    uVar59 = 0;
    do {
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      pTVar20 = local_9d0.
                super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar58 = pScene->mNumMaterials;
      pScene->mNumMaterials = uVar58 + 1;
      pScene->mMaterials[uVar58] = this_00;
      local_840._0_8_ = local_840._0_8_ & 0xffffff0000000000;
      memset(local_840 + 5,0x1b,0x3ff);
      if (pTVar20->alphamap[lVar66] != '\0') {
        local_9b8 = local_9a8;
        sVar32 = strlen(pTVar20->alphamap + lVar66);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_9b8,pTVar20->alphamap + lVar66,
                   pTVar20->alphamap + lVar66 + sVar32);
        pcVar29 = local_9b8;
        sVar32 = local_9b0 & 0xffffffff;
        if ((local_9b0 & 0xfffffc00) != 0) {
          sVar32 = 0x3ff;
        }
        local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_438[0].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,(int)sVar32);
        memcpy((void *)((long)&local_438[0].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4),local_9b8,sVar32);
        *(undefined1 *)
         ((long)&local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + sVar32 + 4) = 0;
        local_840._0_4_ = (int)sVar32;
        memcpy(local_840 + 4,
               (void *)((long)&local_438[0].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4),sVar32);
        local_840[sVar32 + 4] = 0;
        if (pcVar29 != local_9a8) {
          operator_delete(pcVar29);
        }
        aiMaterial::AddProperty(this_00,(aiString *)local_840,"$tex.file",8,0);
      }
      if (pTVar20->texture[lVar66] != '\0') {
        local_9b8 = local_9a8;
        sVar32 = strlen(pTVar20->texture + lVar66);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_9b8,pTVar20->texture + lVar66,pTVar20->texture + lVar66 + sVar32
                  );
        pcVar29 = local_9b8;
        sVar32 = local_9b0 & 0xffffffff;
        if ((local_9b0 & 0xfffffc00) != 0) {
          sVar32 = 0x3ff;
        }
        local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_438[0].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,(int)sVar32);
        memcpy((void *)((long)&local_438[0].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4),local_9b8,sVar32);
        *(undefined1 *)
         ((long)&local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + sVar32 + 4) = 0;
        local_840._0_4_ = (int)sVar32;
        memcpy(local_840 + 4,
               (void *)((long)&local_438[0].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4),sVar32);
        local_840[sVar32 + 4] = 0;
        if (pcVar29 != local_9a8) {
          operator_delete(pcVar29);
        }
        aiMaterial::AddProperty(this_00,(aiString *)local_840,"$tex.file",1,0);
      }
      pcVar29 = pTVar20->name + lVar66;
      if (*pcVar29 != '\0') {
        local_9b8 = local_9a8;
        sVar32 = strlen(pcVar29);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_9b8,pcVar29,pcVar29 + sVar32);
        pcVar29 = local_9b8;
        sVar32 = local_9b0 & 0xffffffff;
        if ((local_9b0 & 0xfffffc00) != 0) {
          sVar32 = 0x3ff;
        }
        local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_438[0].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,(int)sVar32);
        memcpy((void *)((long)&local_438[0].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4),local_9b8,sVar32);
        *(undefined1 *)
         ((long)&local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + sVar32 + 4) = 0;
        local_840._0_4_ = (int)sVar32;
        memcpy(local_840 + 4,
               (void *)((long)&local_438[0].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4),sVar32);
        local_840[sVar32 + 4] = 0;
        if (pcVar29 != local_9a8) {
          operator_delete(pcVar29);
        }
        aiMaterial::AddProperty(this_00,(aiString *)local_840,"?mat.name",0,0);
      }
      aiMaterial::AddBinaryProperty
                (this_00,(void *)((long)&(pTVar20->ambient).r + lVar66),0x10,"$clr.ambient",0,0,
                 aiPTI_Float);
      aiMaterial::AddBinaryProperty
                (this_00,(void *)((long)&(pTVar20->diffuse).r + lVar66),0x10,"$clr.diffuse",0,0,
                 aiPTI_Float);
      aiMaterial::AddBinaryProperty
                (this_00,(void *)((long)&(pTVar20->specular).r + lVar66),0x10,"$clr.specular",0,0,
                 aiPTI_Float);
      aiMaterial::AddBinaryProperty
                (this_00,(void *)((long)&(pTVar20->emissive).r + lVar66),0x10,"$clr.emissive",0,0,
                 aiPTI_Float);
      pInput = (float *)((long)&pTVar20->shininess + lVar66);
      aiMaterial::AddBinaryProperty(this_00,pInput,4,"$mat.shininess",0,0,aiPTI_Float);
      aiMaterial::AddBinaryProperty
                (this_00,(void *)((long)&pTVar20->transparency + lVar66),4,"$mat.opacity",0,0,
                 aiPTI_Float);
      local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(CONCAT44(local_438[0].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,(uint)(0.0 < *pInput))
                    | 2);
      aiMaterial::AddBinaryProperty(this_00,local_438,4,"$mat.shadingm",0,0,aiPTI_Integer);
      uVar59 = uVar59 + 1;
      lVar66 = lVar66 + 400;
    } while (uVar59 < (ulong)(((long)local_9d0.
                                     super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_9d0.
                                     super__Vector_base<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4) *
                             -0x70a3d70a3d70a3d7));
  }
  if (local_950.
      super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_950.
      super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_840._0_8_ = &local_830;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_840,"MS3D: Didn\'t get any group records, file is malformed","");
    std::runtime_error::runtime_error(prVar50,(string *)local_840);
    *(undefined ***)prVar50 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar50,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar59 = ((long)local_950.
                  super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_950.
                  super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
  uVar58 = (uint)uVar59;
  pScene->mNumMeshes = uVar58;
  uVar59 = (uVar59 & 0xffffffff) << 3;
  __s = (aiMesh **)operator_new__(uVar59);
  memset(__s,0,uVar59);
  pScene->mMeshes = __s;
  if (uVar58 != 0) {
    local_928 = 0.0;
    do {
      paVar33 = (aiMesh *)operator_new(0x520);
      paVar33->mPrimitiveTypes = 0;
      paVar33->mNumVertices = 0;
      paVar33->mNumFaces = 0;
      memset(&paVar33->mVertices,0,0xcc);
      paVar33->mBones = (aiBone **)0x0;
      paVar33->mMaterialIndex = 0;
      (paVar33->mName).length = 0;
      (paVar33->mName).data[0] = '\0';
      memset((paVar33->mName).data + 1,0x1b,0x3ff);
      paVar33->mNumAnimMeshes = 0;
      paVar33->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar33->mMethod = 0;
      (paVar33->mAABB).mMin.x = 0.0;
      (paVar33->mAABB).mMin.y = 0.0;
      (paVar33->mAABB).mMin.z = 0.0;
      (paVar33->mAABB).mMax.x = 0.0;
      (paVar33->mAABB).mMax.y = 0.0;
      (paVar33->mAABB).mMax.z = 0.0;
      memset(paVar33->mColors,0,0xa0);
      uVar59 = (ulong)(uint)local_928;
      pScene->mMeshes[uVar59] = paVar33;
      if ((pScene->mNumMaterials != 0) &&
         (pScene->mNumMaterials <
          local_950.
          super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar59].mat)) {
        prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_840._0_8_ = &local_830;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_840,"MS3D: Encountered invalid material index, file is malformed"
                   ,"");
        std::runtime_error::runtime_error(prVar50,(string *)local_840);
        *(undefined ***)prVar50 = &PTR__runtime_error_007fc4b8;
        __cxa_throw(prVar50,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_978 = local_950.
                  super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar59;
      paVar33->mMaterialIndex =
           local_950.
           super__Vector_base<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar59].mat;
      paVar33->mPrimitiveTypes = 4;
      uVar59 = (long)(local_978->triangles).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(local_978->triangles).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      uVar58 = (uint)uVar59;
      paVar33->mNumFaces = uVar58;
      uVar59 = uVar59 & 0xffffffff;
      puVar34 = (ulong *)operator_new__(uVar59 * 0x10 + 8);
      *puVar34 = uVar59;
      paVar35 = (aiFace *)(puVar34 + 1);
      if (uVar59 != 0) {
        paVar52 = paVar35;
        do {
          paVar52->mNumIndices = 0;
          paVar52->mIndices = (uint *)0x0;
          paVar52 = paVar52 + 1;
        } while (paVar52 != paVar35 + uVar59);
      }
      paVar33->mFaces = paVar35;
      paVar33->mNumVertices = uVar58 * 3;
      uVar59 = (ulong)(uVar58 * 3) * 0xc;
      paVar36 = (aiVector3D *)operator_new__(uVar59);
      if (uVar58 != 0) {
        memset(paVar36,0,((uVar59 - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar33->mVertices = paVar36;
      paVar36 = (aiVector3D *)operator_new__(uVar59);
      if (uVar58 != 0) {
        memset(paVar36,0,((uVar59 - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar33->mNormals = paVar36;
      paVar36 = (aiVector3D *)operator_new__(uVar59);
      if (uVar58 != 0) {
        memset(paVar36,0,((uVar59 - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar33->mTextureCoords[0] = paVar36;
      paVar33->mNumUVComponents[0] = 2;
      local_840._8_4_ = _S_red;
      local_830._M_allocated_capacity = 0;
      local_830._8_8_ = local_840 + 8;
      local_818 = 0;
      local_820 = (_Rb_tree_node_base *)local_830._8_8_;
      if (uVar58 != 0) {
        local_988 = &paVar33->mBones;
        uVar59 = 0;
        uVar58 = 0;
        do {
          pTVar22 = local_900.
                    super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar57 = (ulong)(local_978->triangles).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar58];
          if ((ulong)(((long)local_900.
                             super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_900.
                             super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)
              < uVar57) {
            prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&local_438[0].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_438,
                       "MS3D: Encountered invalid triangle index, file is malformed","");
            std::runtime_error::runtime_error(prVar50,(string *)local_438);
            *(undefined ***)prVar50 = &PTR__runtime_error_007fc4b8;
            __cxa_throw(prVar50,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          paVar35 = paVar33->mFaces + uVar58;
          paVar35->mNumIndices = 3;
          puVar37 = (uint *)operator_new__(0xc);
          local_968 = CONCAT44(local_968._4_4_,uVar58);
          paVar35->mIndices = puVar37;
          lVar66 = 0;
          do {
            pTVar21 = local_918.
                      super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar53 = (ulong)pTVar22[uVar57].indices[lVar66];
            if ((ulong)(((long)local_918.
                               super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_918.
                               super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555
                       ) < uVar53) {
              prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&local_438[0].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_438,
                         "MS3D: Encountered invalid vertex index, file is malformed","");
              std::runtime_error::runtime_error(prVar50,(string *)local_438);
              *(undefined ***)prVar50 = &PTR__runtime_error_007fc4b8;
              __cxa_throw(prVar50,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            pTVar1 = local_918.
                     super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar53;
            lVar64 = 0;
            do {
              uVar58 = pTVar21[uVar53].bone_id[lVar64];
              uVar38 = (ulong)uVar58;
              if (uVar38 != 0xffffffff) {
                uVar54 = ((long)local_9e8.
                                super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_9e8.
                                super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x2e8ba2e8ba2e8ba3
                ;
                if (uVar54 < uVar38 || uVar54 - uVar38 == 0) {
                  prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       (pointer)&local_438[0].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_438,
                             "MS3D: Encountered invalid bone index, file is malformed","");
                  std::runtime_error::runtime_error(prVar50,(string *)local_438);
                  *(undefined ***)prVar50 = &PTR__runtime_error_007fc4b8;
                  __cxa_throw(prVar50,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                puVar37 = pTVar21[uVar53].bone_id + lVar64;
                if ((undefined1 *)local_830._M_allocated_capacity != (undefined1 *)0x0) {
                  uVar42 = local_830._M_allocated_capacity;
                  puVar61 = local_840 + 8;
                  do {
                    puVar60 = puVar61;
                    puVar55 = (undefined1 *)uVar42;
                    uVar7 = *(uint *)(puVar55 + 0x20);
                    puVar61 = puVar55;
                    if (uVar7 < uVar58) {
                      puVar61 = puVar60;
                    }
                    uVar42 = *(undefined1 **)(puVar55 + ((ulong)(uVar7 < uVar58) * 2 + 4) * 4);
                  } while (*(undefined1 **)(puVar55 + ((ulong)(uVar7 < uVar58) * 2 + 4) * 4) !=
                           (undefined1 *)0x0);
                  if (puVar61 != local_840 + 8) {
                    if (uVar7 < uVar58) {
                      puVar55 = puVar60;
                    }
                    if (*(uint *)(puVar55 + 0x20) <= uVar58) {
                      pmVar39 = std::
                                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                              *)local_840,puVar37);
                      *pmVar39 = *pmVar39 + 1;
                      goto LAB_00487e78;
                    }
                  }
                }
                pmVar39 = std::
                          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                        *)local_840,puVar37);
                *pmVar39 = 1;
              }
LAB_00487e78:
              lVar64 = lVar64 + 1;
            } while (lVar64 != 4);
            paVar36 = paVar33->mVertices;
            paVar36[uVar59].z = (pTVar1->pos).z;
            fVar68 = (pTVar1->pos).y;
            paVar36 = paVar36 + uVar59;
            paVar36->x = (pTVar1->pos).x;
            paVar36->y = fVar68;
            paVar36 = paVar33->mNormals;
            paVar36[uVar59].z = pTVar22[uVar57].normals[lVar66].z;
            fVar68 = pTVar22[uVar57].normals[lVar66].y;
            paVar36 = paVar36 + uVar59;
            paVar36->x = pTVar22[uVar57].normals[lVar66].x;
            paVar36->y = fVar68;
            fVar68 = pTVar22[uVar57].uv[lVar66].y;
            paVar36 = paVar33->mTextureCoords[0];
            paVar36[uVar59].x = pTVar22[uVar57].uv[lVar66].x;
            paVar36[uVar59].y = 1.0 - fVar68;
            paVar36[uVar59].z = 0.0;
            paVar35->mIndices[lVar66] = (uint)uVar59;
            lVar66 = lVar66 + 1;
            uVar59 = (ulong)((uint)uVar59 + 1);
          } while (lVar66 != 3);
          uVar58 = (int)(float)local_968 + 1;
        } while (uVar58 < paVar33->mNumFaces);
        if (local_818 != 0) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (local_438,
                     ((long)local_9e8.
                            super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_9e8.
                            super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x2e8ba2e8ba2e8ba3,
                     (allocator_type *)&local_9b8);
          uVar59 = local_818 * 8;
          if (0x1fffffffffffffff < local_818) {
            uVar59 = 0xffffffffffffffff;
          }
          __s_00 = (aiBone **)operator_new__(uVar59);
          pppaVar65 = local_988;
          memset(__s_00,0,uVar59);
          *pppaVar65 = __s_00;
          uVar42 = local_830._8_8_;
          if ((_Rb_tree_node_base *)local_830._8_8_ != (_Rb_tree_node_base *)(local_840 + 8)) {
            do {
              paVar40 = (aiBone *)operator_new(0x450);
              (paVar40->mName).length = 0;
              (paVar40->mName).data[0] = '\0';
              memset((paVar40->mName).data + 1,0x1b,0x3ff);
              paVar40->mNumWeights = 0;
              paVar40->mWeights = (aiVertexWeight *)0x0;
              (paVar40->mOffsetMatrix).a1 = 1.0;
              (paVar40->mOffsetMatrix).a2 = 0.0;
              (paVar40->mOffsetMatrix).a3 = 0.0;
              (paVar40->mOffsetMatrix).a4 = 0.0;
              (paVar40->mOffsetMatrix).b1 = 0.0;
              (paVar40->mOffsetMatrix).b2 = 1.0;
              (paVar40->mOffsetMatrix).b3 = 0.0;
              (paVar40->mOffsetMatrix).b4 = 0.0;
              (paVar40->mOffsetMatrix).c1 = 0.0;
              (paVar40->mOffsetMatrix).c2 = 0.0;
              (paVar40->mOffsetMatrix).c3 = 1.0;
              (paVar40->mOffsetMatrix).c4 = 0.0;
              (paVar40->mOffsetMatrix).d1 = 0.0;
              (paVar40->mOffsetMatrix).d2 = 0.0;
              (paVar40->mOffsetMatrix).d3 = 0.0;
              (paVar40->mOffsetMatrix).d4 = 1.0;
              paVar33->mBones[paVar33->mNumBones] = paVar40;
              pTVar62 = local_9e8.
                        super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                        ._M_impl.super__Vector_impl_data._M_start +
                        ((_Rb_tree_node_base *)(uVar42 + 0x20))->_M_color;
              sVar32 = strlen(pTVar62->name);
              aVar28 = (ai_uint32)sVar32;
              if ((int)aVar28 < 0x400) {
                (paVar40->mName).length = aVar28;
                memcpy((paVar40->mName).data,pTVar62,(long)(int)aVar28);
                (paVar40->mName).data[(int)aVar28] = '\0';
              }
              uVar58 = *(uint *)&((_Rb_tree_node_base *)(uVar42 + 0x20))->field_0x4;
              uVar59 = (ulong)uVar58 * 8;
              paVar41 = (aiVertexWeight *)operator_new__(uVar59);
              if (uVar58 != 0) {
                memset(paVar41,0,uVar59);
              }
              paVar40->mWeights = paVar41;
              uVar58 = paVar33->mNumBones;
              paVar33->mNumBones = uVar58 + 1;
              *(uint *)((long)local_438[0].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                       (ulong)((_Rb_tree_node_base *)(uVar42 + 0x20))->_M_color * 4) = uVar58;
              uVar42 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar42);
              pppaVar65 = local_988;
            } while ((_Rb_tree_node_base *)uVar42 != (_Rb_tree_node_base *)(local_840 + 8));
          }
          if (paVar33->mNumFaces != 0) {
            uVar59 = 0;
            uVar58 = 0;
            do {
              uVar7 = (local_978->triangles).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar59];
              lVar66 = 0;
              do {
                uVar8 = local_900.
                        super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7].indices[lVar66];
                lVar64 = -4;
                do {
                  if ((ulong)(uint)local_918.
                                   super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar8].weights
                                   [lVar64 + -1] != 0xffffffff) {
                    paVar40 = (*pppaVar65)
                              [*(uint *)((long)local_438[0].
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start +
                                        (ulong)(uint)local_918.
                                                                                                          
                                                  super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                                  weights[lVar64 + -1] * 4)];
                    paVar41 = paVar40->mWeights;
                    uVar9 = paVar40->mNumWeights;
                    paVar40->mNumWeights = uVar9 + 1;
                    paVar41[uVar9].mVertexId = uVar58;
                    paVar41[uVar9].mWeight =
                         (float)local_918.
                                super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar8 + 1].bone_id
                                [lVar64 + -3];
                  }
                  lVar64 = lVar64 + 1;
                } while (lVar64 != 0);
                lVar66 = lVar66 + 1;
                uVar58 = uVar58 + 1;
              } while (lVar66 != 3);
              uVar59 = uVar59 + 1;
            } while (uVar59 < paVar33->mNumFaces);
          }
          if ((pointer *)
              local_438[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer *)0x0) {
            operator_delete(local_438[0].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_840);
      local_928 = (float)((int)local_928 + 1);
    } while ((uint)local_928 < pScene->mNumMeshes);
  }
  this_01 = (aiNode *)operator_new(0x478);
  local_840._0_8_ = &local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"<MS3DRoot>","");
  aiNode::aiNode(this_01,(string *)local_840);
  pScene->mRootNode = this_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._0_8_ != &local_830) {
    operator_delete((void *)local_840._0_8_);
  }
  uVar58 = pScene->mNumMeshes;
  puVar37 = (uint *)operator_new__((ulong)uVar58 * 4);
  this_01->mMeshes = puVar37;
  if (uVar58 != 0) {
    uVar58 = 0;
    do {
      uVar7 = this_01->mNumMeshes;
      this_01->mNumMeshes = uVar7 + 1;
      this_01->mMeshes[uVar7] = uVar58;
      uVar58 = uVar58 + 1;
    } while (uVar58 < pScene->mNumMeshes);
  }
  if (local_9e8.
      super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_9e8.
      super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppaVar43 = (aiNode **)operator_new__(8);
    *ppaVar43 = (aiNode *)0x0;
    this_01->mChildren = ppaVar43;
    this_01->mNumChildren = 1;
    this_02 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_02);
    *this_01->mChildren = this_02;
    this_02->mParent = this_01;
    CollectChildJoints(local_998,&local_9e8,this_02);
    (this_02->mName).length = 0xf;
    builtin_strncpy((this_02->mName).data,"<MS3DJointRoot>",0x10);
    pScene->mNumAnimations = 1;
    ppaVar44 = (aiAnimation **)operator_new__(8);
    pScene->mAnimations = ppaVar44;
    paVar45 = (aiAnimation *)operator_new(0x448);
    memset((paVar45->mName).data + 0x11,0x1b,0x3ef);
    pTVar62 = local_9e8.
              super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    paVar45->mDuration = -1.0;
    paVar45->mNumChannels = 0;
    paVar45->mChannels = (aiNodeAnim **)0x0;
    paVar45->mNumMeshChannels = 0;
    paVar45->mMeshChannels = (aiMeshAnim **)0x0;
    paVar45->mNumMorphMeshChannels = 0;
    paVar45->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
    *ppaVar44 = paVar45;
    (paVar45->mName).length = 0x10;
    builtin_strncpy((paVar45->mName).data,"<MS3DMasterAnim>",0x11);
    paVar45->mTicksPerSecond = (double)fVar67;
    lVar66 = (long)local_9e8.
                   super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_9e8.
                   super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    uVar59 = 0xffffffffffffffff;
    if ((ulong)(lVar66 * 0x2e8ba2e8ba2e8ba3) < 0x2000000000000000) {
      uVar59 = lVar66 * 0x745d1745d1745d18;
    }
    __s_01 = (aiNodeAnim **)operator_new__(uVar59);
    memset(__s_01,0,uVar59);
    paVar45->mChannels = __s_01;
    if (local_9e8.
        super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
        ._M_impl.super__Vector_impl_data._M_start != pTVar62) {
      local_8d8._8_4_ = 0x3e800000;
      local_8d8._0_8_ = 0x3e800000;
      local_8d8._12_4_ = 0;
      pTVar62 = local_9e8.
                super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (((pTVar62->rotFrames).
             super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pTVar62->rotFrames).
             super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           ((pTVar62->posFrames).
            super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pTVar62->posFrames).
            super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          paVar46 = (aiNodeAnim *)operator_new(0x438);
          (paVar46->mNodeName).length = 0;
          (paVar46->mNodeName).data[0] = '\0';
          memset((paVar46->mNodeName).data + 1,0x1b,0x3ff);
          paVar46->mRotationKeys = (aiQuatKey *)0x0;
          paVar46->mNumScalingKeys = 0;
          *(undefined8 *)&paVar46->mNumPositionKeys = 0;
          *(undefined8 *)((long)&paVar46->mPositionKeys + 4) = 0;
          paVar46->mScalingKeys = (aiVectorKey *)0x0;
          paVar46->mPreState = aiAnimBehaviour_DEFAULT;
          paVar46->mPostState = aiAnimBehaviour_DEFAULT;
          uVar58 = paVar45->mNumChannels;
          paVar45->mNumChannels = uVar58 + 1;
          paVar45->mChannels[uVar58] = paVar46;
          sVar32 = strlen(pTVar62->name);
          aVar28 = (ai_uint32)sVar32;
          if ((int)aVar28 < 0x400) {
            (paVar46->mNodeName).length = aVar28;
            memcpy((paVar46->mNodeName).data,pTVar62,(long)(int)aVar28);
            (paVar46->mNodeName).data[(int)aVar28] = '\0';
          }
          lVar66 = (long)(pTVar62->rotFrames).
                         super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pTVar62->rotFrames).
                         super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar66 != 0) {
            uVar57 = lVar66 >> 4;
            auVar80._8_8_ = 0;
            auVar80._0_8_ = uVar57;
            uVar59 = SUB168(auVar80 * ZEXT816(0x18),0);
            if (SUB168(auVar80 * ZEXT816(0x18),8) != 0) {
              uVar59 = 0xffffffffffffffff;
            }
            paVar47 = (aiQuatKey *)operator_new__(uVar59);
            paVar56 = paVar47;
            do {
              paVar56->mTime = 0.0;
              (paVar56->mValue).w = 1.0;
              (paVar56->mValue).x = 0.0;
              (paVar56->mValue).y = 0.0;
              (paVar56->mValue).z = 0.0;
              paVar56 = paVar56 + 1;
            } while (paVar56 != paVar47 + uVar57);
            paVar46->mRotationKeys = paVar47;
            for (pTVar49 = (pTVar62->rotFrames).
                           super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                pTVar49 !=
                (pTVar62->rotFrames).
                super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                ._M_impl.super__Vector_impl_data._M_finish; pTVar49 = pTVar49 + 1) {
              paVar56 = paVar46->mRotationKeys;
              uVar58 = paVar46->mNumRotationKeys;
              paVar46->mNumRotationKeys = uVar58 + 1;
              paVar56[uVar58].mTime = (double)(pTVar49->time * fVar67);
              fVar68 = (pTVar62->rotation).x;
              fVar70 = (pTVar62->rotation).y;
              fVar71 = (pTVar62->rotation).z;
              fVar69 = cosf(fVar68);
              local_998 = (MS3DImporter *)CONCAT44(extraout_XMM0_Db,fVar69);
              fVar69 = sinf(fVar68);
              fVar68 = cosf(fVar70);
              local_978 = (pointer)CONCAT44(extraout_XMM0_Db_00,fVar68);
              fVar70 = sinf(fVar70);
              fVar68 = cosf(fVar71);
              local_968 = CONCAT44(extraout_XMM0_Db_02,fVar68);
              uStack_960 = extraout_XMM0_Dc_00;
              uStack_95c = extraout_XMM0_Dd_00;
              local_858 = sinf(fVar71);
              local_878 = fVar70 * (float)local_968;
              local_868 = -local_858;
              uStack_864 = extraout_XMM0_Db_03 ^ 0x80000000;
              uStack_860 = extraout_XMM0_Dc_01 ^ 0x80000000;
              uStack_85c = extraout_XMM0_Dd_01 ^ 0x80000000;
              fVar71 = (float)local_978 * local_858;
              local_888 = fVar70 * local_858;
              local_898 = -(float)local_968;
              uStack_894 = local_968._4_4_ ^ 0x80000000;
              uStack_890 = uStack_960 ^ 0x80000000;
              uStack_88c = uStack_95c ^ 0x80000000;
              local_928 = -fVar70;
              uStack_924 = extraout_XMM0_Db_01 ^ 0x80000000;
              uStack_920 = extraout_XMM0_Dc ^ 0x80000000;
              uStack_91c = extraout_XMM0_Dd ^ 0x80000000;
              fVar72 = fVar69 * (float)local_978;
              local_8e8 = (pTVar49->value).x;
              fVar68 = (pTVar49->value).y;
              local_988 = (aiBone ***)CONCAT44(local_988._4_4_,(pTVar49->value).z);
              local_8a8 = cosf(local_8e8);
              uStack_8a4 = extraout_XMM0_Db_04;
              uStack_8a0 = extraout_XMM0_Dc_02;
              uStack_89c = extraout_XMM0_Dd_02;
              local_8e8 = sinf(local_8e8);
              local_8b8 = cosf(fVar68);
              fVar68 = sinf(fVar68);
              local_8c8 = cosf((float)local_988);
              fVar73 = sinf((float)local_988);
              fVar75 = local_8a8 * local_8b8;
              local_988 = (aiBone ***)CONCAT44(uStack_8a4,fVar75);
              uStack_980 = uStack_8a0;
              uStack_97c = uStack_89c;
              fVar82 = local_8c8 * local_8b8;
              fVar83 = (float)local_968 * (float)local_978;
              fVar94 = local_8e8 * local_8b8;
              fVar97 = (float)local_998 * (float)local_978;
              fVar87 = local_878 * fVar69 + local_868 * (float)local_998;
              fVar88 = (float)local_968 * (float)local_998 + local_888 * fVar69;
              fVar78 = local_8b8 * fVar73;
              fVar89 = local_858 * fVar69 + local_878 * (float)local_998;
              fVar91 = local_888 * (float)local_998 + local_898 * fVar69;
              fVar84 = (fVar83 * fVar82 + fVar87 * fVar78) - fVar68 * fVar89;
              fVar69 = fVar73 * local_8e8 + fVar68 * local_8c8 * local_8a8;
              fVar74 = fVar68 * local_8c8 * local_8e8 + -fVar73 * local_8a8;
              fVar85 = fVar68 * fVar73 * local_8a8 + -local_8c8 * local_8e8;
              fVar86 = local_8c8 * local_8a8 + fVar68 * fVar73 * local_8e8;
              fVar90 = fVar75 * fVar97 + local_928 * fVar69 + fVar72 * fVar85;
              fVar92 = fVar91 * fVar94 + fVar71 * fVar74 + fVar88 * fVar86;
              fVar73 = fVar84 + 0.0;
              fVar93 = fVar91 * fVar75 + fVar69 * fVar71 + fVar88 * fVar85 + 0.0;
              fVar75 = fVar75 * fVar89 + fVar69 * fVar83 + fVar85 * fVar87 + 0.0;
              fVar85 = -fVar68 * fVar91 + fVar71 * fVar82 + fVar78 * fVar88 + 0.0;
              fVar78 = -fVar68 * fVar97 + local_928 * fVar82 + fVar78 * fVar72 + 0.0;
              fVar82 = fVar89 * fVar94 + fVar74 * fVar83 + fVar86 * fVar87 + 0.0;
              fVar69 = fVar97 * fVar94 + (fVar86 * fVar72 - fVar74 * fVar70) + 0.0;
              fVar70 = fVar90 + 0.0;
              fVar71 = fVar92 + 0.0;
              fVar68 = fVar73 + fVar71 + fVar70;
              if (fVar68 <= 0.0) {
                auVar14._4_4_ = -(uint)(fVar90 < fVar84);
                auVar14._0_4_ = -(uint)(fVar90 < fVar84);
                auVar14._8_4_ = -(uint)(fVar92 < fVar84);
                auVar14._12_4_ = -(uint)(fVar92 < fVar84);
                iVar27 = movmskpd(extraout_EAX,auVar14);
                if (iVar27 == 3) {
                  fVar70 = ((fVar73 + 1.0) - fVar71) - fVar70;
                  if (fVar70 < 0.0) {
                    fVar70 = sqrtf(fVar70);
                  }
                  else {
                    fVar70 = SQRT(fVar70);
                  }
                  fVar70 = fVar70 + fVar70;
                  auVar77._4_4_ = fVar70;
                  auVar77._0_4_ = fVar69 - fVar93;
                  auVar77._8_4_ = fVar82 + fVar85;
                  auVar77._12_4_ = fVar78 + fVar75;
                  auVar11._4_4_ = fVar70;
                  auVar11._0_4_ = fVar70;
                  auVar11._8_4_ = fVar70;
                  auVar11._12_4_ = fVar70;
                  auVar80 = divps(auVar77,auVar11);
                  aVar81.x = fVar70 * 0.25;
                  aVar81.w = (float)auVar80._0_4_;
                  aVar81.y = (float)auVar80._8_4_;
                  aVar81.z = auVar80._12_4_;
                }
                else if (fVar92 <= fVar90) {
                  fVar71 = ((fVar70 + 1.0) - fVar73) - fVar71;
                  if (fVar71 < 0.0) {
                    fVar71 = sqrtf(fVar71);
                  }
                  else {
                    fVar71 = SQRT(fVar71);
                  }
                  fVar71 = fVar71 + fVar71;
                  auVar96._4_4_ = fVar75 + fVar78;
                  auVar96._0_4_ = fVar85 - fVar82;
                  auVar96._8_4_ = fVar93 + fVar69;
                  auVar96._12_4_ = 0x3e800000;
                  auVar13._4_4_ = fVar71;
                  auVar13._0_4_ = fVar71;
                  auVar13._8_4_ = fVar71;
                  auVar13._12_4_ = fVar71;
                  auVar80 = divps(auVar96,auVar13);
                  aVar81._0_12_ = auVar80._0_12_;
                  aVar81.z = fVar71 * 0.25;
                }
                else {
                  fVar70 = ((fVar71 + 1.0) - fVar73) - fVar70;
                  if (fVar70 < 0.0) {
                    fVar70 = sqrtf(fVar70);
                  }
                  else {
                    fVar70 = SQRT(fVar70);
                  }
                  fVar70 = fVar70 + fVar70;
                  auVar95._4_4_ = fVar85 + fVar82;
                  auVar95._0_4_ = fVar75 - fVar78;
                  auVar95._8_4_ = 0x3e800000;
                  auVar95._12_4_ = fVar93 + fVar69;
                  auVar12._4_4_ = fVar70;
                  auVar12._0_4_ = fVar70;
                  auVar12._8_4_ = fVar70;
                  auVar12._12_4_ = fVar70;
                  auVar80 = divps(auVar95,auVar12);
                  aVar81.z = auVar80._12_4_;
                  aVar81._0_8_ = auVar80._0_8_;
                  aVar81.y = fVar70 * (float)local_8d8._8_4_;
                }
              }
              else {
                fVar68 = fVar68 + 1.0;
                if (fVar68 < 0.0) {
                  fVar68 = sqrtf(fVar68);
                }
                else {
                  fVar68 = SQRT(fVar68);
                }
                auVar79._0_4_ = fVar69 - fVar93;
                auVar79._4_4_ = fVar69 - fVar93;
                auVar79._8_4_ = fVar75 - fVar78;
                auVar79._12_4_ = fVar85 - fVar82;
                fVar68 = fVar68 + fVar68;
                auVar76._4_4_ = fVar68;
                auVar76._0_4_ = fVar68;
                auVar76._8_4_ = fVar68;
                auVar76._12_4_ = fVar68;
                auVar80 = divps(auVar79,auVar76);
                aVar81._4_12_ = auVar80._4_12_;
                aVar81.w = fVar68 * 0.25;
              }
              paVar56[uVar58].mValue = aVar81;
            }
          }
          lVar66 = (long)(pTVar62->posFrames).
                         super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pTVar62->posFrames).
                         super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar66 != 0) {
            uVar57 = lVar66 >> 4;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar57;
            uVar59 = SUB168(auVar10 * ZEXT816(0x18),0);
            if (SUB168(auVar10 * ZEXT816(0x18),8) != 0) {
              uVar59 = 0xffffffffffffffff;
            }
            paVar48 = (aiVectorKey *)operator_new__(uVar59);
            lVar66 = 0;
            do {
              puVar18 = (undefined8 *)((long)&paVar48->mTime + lVar66);
              *puVar18 = 0;
              puVar18[1] = 0;
              *(undefined4 *)((long)&(paVar48->mValue).z + lVar66) = 0;
              lVar66 = lVar66 + 0x18;
            } while (uVar57 * 0x18 != lVar66);
            paVar46->mPositionKeys = paVar48;
            pTVar49 = (pTVar62->posFrames).
                      super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pTVar49 !=
                (pTVar62->posFrames).
                super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                paVar48 = paVar46->mPositionKeys;
                uVar58 = paVar46->mNumPositionKeys;
                paVar46->mNumPositionKeys = uVar58 + 1;
                paVar48[uVar58].mTime = (double)(pTVar49->time * fVar67);
                uVar3 = (pTVar62->position).x;
                uVar5 = (pTVar62->position).y;
                uVar4 = (pTVar49->value).x;
                uVar6 = (pTVar49->value).y;
                fVar68 = (pTVar62->position).z;
                fVar70 = (pTVar49->value).z;
                paVar48[uVar58].mValue.x = (float)uVar4 + (float)uVar3;
                paVar48[uVar58].mValue.y = (float)uVar6 + (float)uVar5;
                paVar48[uVar58].mValue.z = fVar68 + fVar70;
                pTVar49 = pTVar49 + 1;
              } while (pTVar49 !=
                       (pTVar62->posFrames).
                       super__Vector_base<Assimp::MS3DImporter::TempKeyFrame,_std::allocator<Assimp::MS3DImporter::TempKeyFrame>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
          }
        }
        pTVar62 = pTVar62 + 1;
      } while (pTVar62 !=
               local_9e8.
               super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      if (paVar45->mNumChannels != 0) goto LAB_00488d91;
    }
    paVar45->mChannels = (aiNodeAnim **)0x0;
  }
LAB_00488d91:
  std::vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>::
  ~vector(&local_9e8);
  std::
  vector<Assimp::MS3DImporter::TempMaterial,_std::allocator<Assimp::MS3DImporter::TempMaterial>_>::
  ~vector(&local_9d0);
  std::vector<Assimp::MS3DImporter::TempGroup,_std::allocator<Assimp::MS3DImporter::TempGroup>_>::
  ~vector(&local_950);
  if (local_900.
      super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_900.
                    super__Vector_base<Assimp::MS3DImporter::TempTriangle,_std::allocator<Assimp::MS3DImporter::TempTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_918.
      super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_918.
                    super__Vector_base<Assimp::MS3DImporter::TempVertex,_std::allocator<Assimp::MS3DImporter::TempVertex>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  StreamReader<false,_false>::~StreamReader(&local_a20);
  return;
}

Assistant:

void MS3DImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderLE stream(pIOHandler->Open(pFile,"rb"));

    // CanRead() should have done this already
    char head[10];
    int32_t version;

    mScene = pScene;


    // 1 ------------ read into temporary data structures mirroring the original file

    stream.CopyAndAdvance(head,10);
    stream >> version;
    if (strncmp(head,"MS3D000000",10)) {
        throw DeadlyImportError("Not a MS3D file, magic string MS3D000000 not found: "+pFile);
    }

    if (version != 4) {
        throw DeadlyImportError("MS3D: Unsupported file format version, 4 was expected");
    }

    uint16_t verts;
    stream >> verts;

    std::vector<TempVertex> vertices(verts);
    for (unsigned int i = 0; i < verts; ++i) {
        TempVertex& v = vertices[i];

        stream.IncPtr(1);
        ReadVector(stream,v.pos);
        v.bone_id[0] = stream.GetI1();
        v.ref_cnt = stream.GetI1();

        v.bone_id[1] = v.bone_id[2] = v.bone_id[3] = UINT_MAX;
        v.weights[1] = v.weights[2] = v.weights[3] = 0.f;
        v.weights[0] = 1.f;
    }

    uint16_t tris;
    stream >> tris;

    std::vector<TempTriangle> triangles(tris);
    for (unsigned int i = 0;i < tris; ++i) {
        TempTriangle& t = triangles[i];

        stream.IncPtr(2);
        for (unsigned int i = 0; i < 3; ++i) {
            t.indices[i] = stream.GetI2();
        }

        for (unsigned int i = 0; i < 3; ++i) {
            ReadVector(stream,t.normals[i]);
        }

        for (unsigned int i = 0; i < 3; ++i) {
            stream >> (float&)(t.uv[i].x); // see note in ReadColor()
        }
        for (unsigned int i = 0; i < 3; ++i) {
            stream >> (float&)(t.uv[i].y);
        }

        t.sg    = stream.GetI1();
        t.group = stream.GetI1();
    }

    uint16_t grp;
    stream >> grp;

    bool need_default = false;
    std::vector<TempGroup> groups(grp);
    for (unsigned int i = 0;i < grp; ++i) {
        TempGroup& t = groups[i];

        stream.IncPtr(1);
        stream.CopyAndAdvance(t.name,32);

        t.name[32] = '\0';
        uint16_t num;
        stream >> num;

        t.triangles.resize(num);
        for (unsigned int i = 0; i < num; ++i) {
            t.triangles[i] = stream.GetI2();
        }
        t.mat = stream.GetI1();
        if (t.mat == UINT_MAX) {
            need_default = true;
        }
    }

    uint16_t mat;
    stream >> mat;

    std::vector<TempMaterial> materials(mat);
    for (unsigned int i = 0;i < mat; ++i) {
        TempMaterial& t = materials[i];

        stream.CopyAndAdvance(t.name,32);
        t.name[32] = '\0';

        ReadColor(stream,t.ambient);
        ReadColor(stream,t.diffuse);
        ReadColor(stream,t.specular);
        ReadColor(stream,t.emissive);
        stream >> t.shininess  >> t.transparency;

        stream.IncPtr(1);

        stream.CopyAndAdvance(t.texture,128);
        t.texture[128] = '\0';

        stream.CopyAndAdvance(t.alphamap,128);
        t.alphamap[128] = '\0';
    }

    float animfps, currenttime;
    uint32_t totalframes;
    stream >> animfps >> currenttime >> totalframes;

    uint16_t joint;
    stream >> joint;

    std::vector<TempJoint> joints(joint);
    for(unsigned int i = 0; i < joint; ++i) {
        TempJoint& j = joints[i];

        stream.IncPtr(1);
        stream.CopyAndAdvance(j.name,32);
        j.name[32] = '\0';

        stream.CopyAndAdvance(j.parentName,32);
        j.parentName[32] = '\0';

        ReadVector(stream,j.rotation);
        ReadVector(stream,j.position);

        j.rotFrames.resize(stream.GetI2());
        j.posFrames.resize(stream.GetI2());

        for(unsigned int a = 0; a < j.rotFrames.size(); ++a) {
            TempKeyFrame& kf = j.rotFrames[a];
            stream >> kf.time;
            ReadVector(stream,kf.value);
        }
        for(unsigned int a = 0; a < j.posFrames.size(); ++a) {
            TempKeyFrame& kf = j.posFrames[a];
            stream >> kf.time;
            ReadVector(stream,kf.value);
        }
    }

    if(stream.GetRemainingSize() > 4) {
        uint32_t subversion;
        stream >> subversion;
        if (subversion == 1) {
            ReadComments<TempGroup>(stream,groups);
            ReadComments<TempMaterial>(stream,materials);
            ReadComments<TempJoint>(stream,joints);

            // model comment - print it for we have such a nice log.
            if (stream.GetI4()) {
                const size_t len = static_cast<size_t>(stream.GetI4());
                if (len > stream.GetRemainingSize()) {
                    throw DeadlyImportError("MS3D: Model comment is too long");
                }

                const std::string& s = std::string(reinterpret_cast<char*>(stream.GetPtr()),len);
                ASSIMP_LOG_DEBUG_F("MS3D: Model comment: ", s);
            }

            if(stream.GetRemainingSize() > 4 && inrange((stream >> subversion,subversion),1u,3u)) {
                for(unsigned int i = 0; i < verts; ++i) {
                    TempVertex& v = vertices[i];
                    v.weights[3]=1.f;
                    for(unsigned int n = 0; n < 3; v.weights[3]-=v.weights[n++]) {
                        v.bone_id[n+1] = stream.GetI1();
                        v.weights[n] = static_cast<float>(static_cast<unsigned int>(stream.GetI1()))/255.f;
                    }
                    stream.IncPtr((subversion-1)<<2u);
                }

                // even further extra data is not of interest for us, at least now now.
            }
        }
    }

    // 2 ------------ convert to proper aiXX data structures -----------------------------------

    if (need_default && materials.size()) {
        ASSIMP_LOG_WARN("MS3D: Found group with no material assigned, spawning default material");
        // if one of the groups has no material assigned, but there are other
        // groups with materials, a default material needs to be added (
        // scenepreprocessor adds a default material only if nummat==0).
        materials.push_back(TempMaterial());
        TempMaterial& m = materials.back();

        strcpy(m.name,"<MS3D_DefaultMat>");
        m.diffuse = aiColor4D(0.6f,0.6f,0.6f,1.0);
        m.transparency = 1.f;
        m.shininess = 0.f;

        // this is because these TempXXX struct's have no c'tors.
        m.texture[0] = m.alphamap[0] = '\0';

        for (unsigned int i = 0; i < groups.size(); ++i) {
            TempGroup& g = groups[i];
            if (g.mat == UINT_MAX) {
                g.mat = static_cast<unsigned int>(materials.size()-1);
            }
        }
    }

    // convert materials to our generic key-value dict-alike
    if (materials.size()) {
        pScene->mMaterials = new aiMaterial*[materials.size()];
        for (size_t i = 0; i < materials.size(); ++i) {

            aiMaterial* mo = new aiMaterial();
            pScene->mMaterials[pScene->mNumMaterials++] = mo;

            const TempMaterial& mi = materials[i];

            aiString tmp;
            if (0[mi.alphamap]) {
                tmp = aiString(mi.alphamap);
                mo->AddProperty(&tmp,AI_MATKEY_TEXTURE_OPACITY(0));
            }
            if (0[mi.texture]) {
                tmp = aiString(mi.texture);
                mo->AddProperty(&tmp,AI_MATKEY_TEXTURE_DIFFUSE(0));
            }
            if (0[mi.name]) {
                tmp = aiString(mi.name);
                mo->AddProperty(&tmp,AI_MATKEY_NAME);
            }

            mo->AddProperty(&mi.ambient,1,AI_MATKEY_COLOR_AMBIENT);
            mo->AddProperty(&mi.diffuse,1,AI_MATKEY_COLOR_DIFFUSE);
            mo->AddProperty(&mi.specular,1,AI_MATKEY_COLOR_SPECULAR);
            mo->AddProperty(&mi.emissive,1,AI_MATKEY_COLOR_EMISSIVE);

            mo->AddProperty(&mi.shininess,1,AI_MATKEY_SHININESS);
            mo->AddProperty(&mi.transparency,1,AI_MATKEY_OPACITY);

            const int sm = mi.shininess>0.f?aiShadingMode_Phong:aiShadingMode_Gouraud;
            mo->AddProperty(&sm,1,AI_MATKEY_SHADING_MODEL);
        }
    }

    // convert groups to meshes
    if (groups.empty()) {
        throw DeadlyImportError("MS3D: Didn't get any group records, file is malformed");
    }

    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes=static_cast<unsigned int>(groups.size())]();
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {

        aiMesh* m = pScene->mMeshes[i] = new aiMesh();
        const TempGroup& g = groups[i];

        if (pScene->mNumMaterials && g.mat > pScene->mNumMaterials) {
            throw DeadlyImportError("MS3D: Encountered invalid material index, file is malformed");
        } // no error if no materials at all - scenepreprocessor adds one then

        m->mMaterialIndex  = g.mat;
        m->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        m->mFaces = new aiFace[m->mNumFaces = static_cast<unsigned int>(g.triangles.size())];
        m->mNumVertices = m->mNumFaces*3;

        // storage for vertices - verbose format, as requested by the postprocessing pipeline
        m->mVertices = new aiVector3D[m->mNumVertices];
        m->mNormals  = new aiVector3D[m->mNumVertices];
        m->mTextureCoords[0] = new aiVector3D[m->mNumVertices];
        m->mNumUVComponents[0] = 2;

        typedef std::map<unsigned int,unsigned int> BoneSet;
        BoneSet mybones;

        for (unsigned int i = 0,n = 0; i < m->mNumFaces; ++i) {
            aiFace& f = m->mFaces[i];
            if (g.triangles[i]>triangles.size()) {
                throw DeadlyImportError("MS3D: Encountered invalid triangle index, file is malformed");
            }

            TempTriangle& t = triangles[g.triangles[i]];
            f.mIndices = new unsigned int[f.mNumIndices=3];

            for (unsigned int i = 0; i < 3; ++i,++n) {
                if (t.indices[i]>vertices.size()) {
                    throw DeadlyImportError("MS3D: Encountered invalid vertex index, file is malformed");
                }

                const TempVertex& v = vertices[t.indices[i]];
                for(unsigned int a = 0; a < 4; ++a) {
                    if (v.bone_id[a] != UINT_MAX) {
                        if (v.bone_id[a] >= joints.size()) {
                            throw DeadlyImportError("MS3D: Encountered invalid bone index, file is malformed");
                        }
                        if (mybones.find(v.bone_id[a]) == mybones.end()) {
                             mybones[v.bone_id[a]] = 1;
                        }
                        else ++mybones[v.bone_id[a]];
                    }
                }

                // collect vertex components
                m->mVertices[n] = v.pos;

                m->mNormals[n] = t.normals[i];
                m->mTextureCoords[0][n] = aiVector3D(t.uv[i].x,1.f-t.uv[i].y,0.0);
                f.mIndices[i] = n;
            }
        }

        // allocate storage for bones
        if(!mybones.empty()) {
            std::vector<unsigned int> bmap(joints.size());
            m->mBones = new aiBone*[mybones.size()]();
            for(BoneSet::const_iterator it = mybones.begin(); it != mybones.end(); ++it) {
                aiBone* const bn = m->mBones[m->mNumBones] = new aiBone();
                const TempJoint& jnt = joints[(*it).first];

                bn->mName.Set(jnt.name);
                bn->mWeights = new aiVertexWeight[(*it).second];

                bmap[(*it).first] = m->mNumBones++;
            }

            // .. and collect bone weights
            for (unsigned int i = 0,n = 0; i < m->mNumFaces; ++i) {
                TempTriangle& t = triangles[g.triangles[i]];

                for (unsigned int i = 0; i < 3; ++i,++n) {
                    const TempVertex& v = vertices[t.indices[i]];
                    for(unsigned int a = 0; a < 4; ++a) {
                        const unsigned int bone = v.bone_id[a];
                        if(bone==UINT_MAX){
                            continue;
                        }

                        aiBone* const outbone = m->mBones[bmap[bone]];
                        aiVertexWeight& outwght = outbone->mWeights[outbone->mNumWeights++];

                        outwght.mVertexId = n;
                        outwght.mWeight = v.weights[a];
                    }
                }
            }
        }
    }

    // ... add dummy nodes under a single root, each holding a reference to one
    // mesh. If we didn't do this, we'd lose the group name.
    aiNode* rt = pScene->mRootNode = new aiNode("<MS3DRoot>");

#ifdef ASSIMP_BUILD_MS3D_ONE_NODE_PER_MESH
    rt->mChildren = new aiNode*[rt->mNumChildren=pScene->mNumMeshes+(joints.size()?1:0)]();

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        aiNode* nd = rt->mChildren[i] = new aiNode();

        const TempGroup& g = groups[i];

        // we need to generate an unique name for all mesh nodes.
        // since we want to keep the group name, a prefix is
        // prepended.
        nd->mName = aiString("<MS3DMesh>_");
        nd->mName.Append(g.name);
        nd->mParent = rt;

        nd->mMeshes = new unsigned int[nd->mNumMeshes = 1];
        nd->mMeshes[0] = i;
    }
#else
    rt->mMeshes = new unsigned int[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        rt->mMeshes[rt->mNumMeshes++] = i;
    }
#endif

    // convert animations as well
    if(joints.size()) {
#ifndef ASSIMP_BUILD_MS3D_ONE_NODE_PER_MESH
        rt->mChildren = new aiNode*[1]();
        rt->mNumChildren = 1;

        aiNode* jt = rt->mChildren[0] = new aiNode();
#else
        aiNode* jt = rt->mChildren[pScene->mNumMeshes] = new aiNode();
#endif
        jt->mParent = rt;
        CollectChildJoints(joints,jt);
        jt->mName.Set("<MS3DJointRoot>");

        pScene->mAnimations = new aiAnimation*[ pScene->mNumAnimations = 1 ];
        aiAnimation* const anim = pScene->mAnimations[0] = new aiAnimation();

        anim->mName.Set("<MS3DMasterAnim>");

        // carry the fps info to the user by scaling all times with it
        anim->mTicksPerSecond = animfps;

        // leave duration at its default, so ScenePreprocessor will fill an appropriate
        // value (the values taken from some MS3D files seem to be too unreliable
        // to pass the validation)
        // anim->mDuration = totalframes/animfps;

        anim->mChannels = new aiNodeAnim*[joints.size()]();
        for(std::vector<TempJoint>::const_iterator it = joints.begin(); it != joints.end(); ++it) {
            if ((*it).rotFrames.empty() && (*it).posFrames.empty()) {
                continue;
            }

            aiNodeAnim* nd = anim->mChannels[anim->mNumChannels++] = new aiNodeAnim();
            nd->mNodeName.Set((*it).name);

            if ((*it).rotFrames.size()) {
                nd->mRotationKeys = new aiQuatKey[(*it).rotFrames.size()];
                for(std::vector<TempKeyFrame>::const_iterator rot = (*it).rotFrames.begin(); rot != (*it).rotFrames.end(); ++rot) {
                    aiQuatKey& q = nd->mRotationKeys[nd->mNumRotationKeys++];

                    q.mTime = (*rot).time*animfps;
                    q.mValue = aiQuaternion(aiMatrix3x3(aiMatrix4x4().FromEulerAnglesXYZ((*it).rotation)*
                        aiMatrix4x4().FromEulerAnglesXYZ((*rot).value)));
                }
            }

            if ((*it).posFrames.size()) {
                nd->mPositionKeys = new aiVectorKey[(*it).posFrames.size()];

                aiQuatKey* qu = nd->mRotationKeys;
                for(std::vector<TempKeyFrame>::const_iterator pos = (*it).posFrames.begin(); pos != (*it).posFrames.end(); ++pos,++qu) {
                    aiVectorKey& v = nd->mPositionKeys[nd->mNumPositionKeys++];

                    v.mTime = (*pos).time*animfps;
                    v.mValue = (*it).position + (*pos).value;
                }
            }
        }
        // fixup to pass the validation if not a single animation channel is non-trivial
        if (!anim->mNumChannels) {
            anim->mChannels = NULL;
        }
    }
}